

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

NumberFormat *
icu_63::NumberFormat::makeInstance
          (Locale *desiredLocale,UNumberFormatStyle style,UBool mustBeDecimalFormat,
          UErrorCode *status)

{
  Locale *other;
  bool bVar1;
  UBool UVar2;
  int8_t iVar3;
  int32_t iVar4;
  NumberingSystem *p;
  char *pcVar5;
  UResourceBundle *pUVar6;
  DecimalFormatSymbols *pDVar7;
  char16_t *s;
  RuleBasedNumberFormat *this;
  DecimalFormat *pDVar8;
  NumberFormat *this_00;
  char *actual;
  UnicodeString *pUVar9;
  DecimalFormat *local_660;
  RuleBasedNumberFormat *local_648;
  DecimalFormatSymbols *local_5c8;
  LocalPointerBase<icu_63::DecimalFormat> local_570;
  LocalPointer<icu_63::DecimalFormat> df;
  DecimalFormatSymbols *syms;
  UnicodeString local_558;
  ConstChar16Ptr local_518;
  UnicodeString local_510;
  undefined1 local_4c9;
  RuleBasedNumberFormat *local_4c8;
  RuleBasedNumberFormat *local_4c0;
  RuleBasedNumberFormat *r;
  undefined1 local_4b0 [8];
  UnicodeString SpelloutRules;
  UnicodeString local_390;
  undefined1 local_350 [8];
  CharString nsLocID;
  int32_t lastSlash;
  int32_t firstSlash;
  URBNFRuleSetTag local_2c4;
  undefined1 local_2c0 [4];
  URBNFRuleSetTag desiredRulesType;
  Locale nsLoc;
  UnicodeString nsRuleSetName;
  UnicodeString nsRuleSetGroup;
  UnicodeString nsDesc;
  LocalPointer<icu_63::NumberFormat> f;
  UChar *currPattern;
  UnicodeString local_108;
  char16_t *local_c8;
  char16_t *patternPtr;
  DecimalFormatSymbols *local_b8;
  LocalPointerBase<UResourceBundle> local_b0;
  LocalUResourceBundlePointer ownedResource;
  UnicodeString pattern;
  LocalPointer<icu_63::DecimalFormatSymbols> symbolsToAdopt;
  Mutex local_58;
  Mutex lock;
  NumberingSystem *pNStack_38;
  int32_t hashKey;
  NumberingSystem *ns;
  LocalPointer<icu_63::NumberingSystem> ownedNs;
  UErrorCode *status_local;
  UBool mustBeDecimalFormat_local;
  UNumberFormatStyle style_local;
  Locale *desiredLocale_local;
  
  ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr =
       (LocalPointerBase<icu_63::NumberingSystem>)(LocalPointerBase<icu_63::NumberingSystem>)status;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return (NumberFormat *)0x0;
  }
  if (((int)style < 0) || (0x10 < (int)style)) {
    *(undefined4 *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr = 1;
    return (NumberFormat *)0x0;
  }
  UVar2 = isStyleSupported(style);
  if (UVar2 == '\0') {
    *(undefined4 *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr = 0x10;
    return (NumberFormat *)0x0;
  }
  umtx_initOnce(&gNSCacheInitOnce,nscacheInit);
  LocalPointer<icu_63::NumberingSystem>::LocalPointer
            ((LocalPointer<icu_63::NumberingSystem> *)&ns,(NumberingSystem *)0x0);
  if (NumberingSystem_cache == (UHashtable *)0x0) {
    p = NumberingSystem::createInstance
                  (desiredLocale,
                   (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
    LocalPointer<icu_63::NumberingSystem>::adoptInstead
              ((LocalPointer<icu_63::NumberingSystem> *)&ns,p);
    pNStack_38 = LocalPointerBase<icu_63::NumberingSystem>::getAlias
                           ((LocalPointerBase<icu_63::NumberingSystem> *)&ns);
  }
  else {
    iVar4 = Locale::hashCode(desiredLocale);
    Mutex::Mutex(&local_58,&nscacheMutex);
    pNStack_38 = (NumberingSystem *)uhash_iget_63(NumberingSystem_cache,iVar4);
    if (pNStack_38 == (NumberingSystem *)0x0) {
      pNStack_38 = NumberingSystem::createInstance
                             (desiredLocale,
                              (UErrorCode *)
                              ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
      uhash_iput_63(NumberingSystem_cache,iVar4,pNStack_38,
                    (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
    }
    Mutex::~Mutex(&local_58);
  }
  UVar2 = ::U_FAILURE(*(UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
  if (UVar2 != '\0') {
    desiredLocale_local = (Locale *)0x0;
    goto LAB_0034d46a;
  }
  if ((mustBeDecimalFormat != '\0') &&
     (UVar2 = NumberingSystem::isAlgorithmic(pNStack_38), UVar2 != '\0')) {
    *(undefined4 *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr = 0x10;
    desiredLocale_local = (Locale *)0x0;
    goto LAB_0034d46a;
  }
  LocalPointer<icu_63::DecimalFormatSymbols>::LocalPointer
            ((LocalPointer<icu_63::DecimalFormatSymbols> *)((long)&pattern.fUnion + 0x30),
             (DecimalFormatSymbols *)0x0);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&ownedResource);
  pcVar5 = Locale::getName(desiredLocale);
  pUVar6 = ures_open_63((char *)0x0,pcVar5,
                        (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_b0,pUVar6);
  UVar2 = ::U_FAILURE(*(UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
  if (UVar2 == '\0') {
    pDVar7 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pUVar6);
    patternPtr._7_1_ = 0;
    local_5c8 = (DecimalFormatSymbols *)0x0;
    if (pDVar7 != (DecimalFormatSymbols *)0x0) {
      patternPtr._7_1_ = 1;
      local_b8 = pDVar7;
      DecimalFormatSymbols::DecimalFormatSymbols
                (pDVar7,desiredLocale,
                 (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
      local_5c8 = pDVar7;
    }
    LocalPointer<icu_63::DecimalFormatSymbols>::adoptInsteadAndCheckErrorCode
              ((LocalPointer<icu_63::DecimalFormatSymbols> *)((long)&pattern.fUnion + 0x30),
               local_5c8,(UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
    UVar2 = ::U_FAILURE(*(UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
    if (UVar2 == '\0') {
      pcVar5 = NumberingSystem::getName(pNStack_38);
      local_c8 = icu_63::number::impl::utils::getPatternForStyle
                           (desiredLocale,pcVar5,gFormatCldrStyles[style],
                            (UErrorCode *)
                            ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&currPattern,local_c8);
      icu_63::UnicodeString::UnicodeString(&local_108,'\x01',(ConstChar16Ptr *)&currPattern,-1);
      icu_63::UnicodeString::operator=((UnicodeString *)&ownedResource,&local_108);
      icu_63::UnicodeString::~UnicodeString(&local_108);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&currPattern);
      UVar2 = ::U_FAILURE(*(UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr
                         );
      if (UVar2 == '\0') {
        if ((((style == UNUM_CURRENCY) || (style == UNUM_CURRENCY_ISO)) ||
            (style == UNUM_CURRENCY_ACCOUNTING)) ||
           ((style == UNUM_CASH_CURRENCY || (style == UNUM_CURRENCY_STANDARD)))) {
          pDVar7 = LocalPointerBase<icu_63::DecimalFormatSymbols>::operator->
                             ((LocalPointerBase<icu_63::DecimalFormatSymbols> *)
                              ((long)&pattern.fUnion + 0x30));
          s = DecimalFormatSymbols::getCurrencyPattern(pDVar7);
          if (s != (char16_t *)0x0) {
            iVar4 = u_strlen_63(s);
            icu_63::UnicodeString::setTo((UnicodeString *)&ownedResource,s,iVar4);
          }
        }
        pUVar9 = (UnicodeString *)0x0;
        LocalPointer<icu_63::NumberFormat>::LocalPointer
                  ((LocalPointer<icu_63::NumberFormat> *)((long)&nsDesc.fUnion + 0x30),
                   (NumberFormat *)0x0);
        UVar2 = NumberingSystem::isAlgorithmic(pNStack_38);
        if (UVar2 == '\0') {
          if (style == UNUM_CURRENCY_ISO) {
            ConstChar16Ptr::ConstChar16Ptr(&local_518,L"¤");
            icu_63::UnicodeString::UnicodeString(&local_510,'\x01',&local_518,1);
            ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&syms,L"¤¤");
            icu_63::UnicodeString::UnicodeString(&local_558,'\x01',(ConstChar16Ptr *)&syms,2);
            pUVar9 = &local_510;
            icu_63::UnicodeString::findAndReplace((UnicodeString *)&ownedResource,pUVar9,&local_558)
            ;
            icu_63::UnicodeString::~UnicodeString(&local_558);
            ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&syms);
            icu_63::UnicodeString::~UnicodeString(&local_510);
            ConstChar16Ptr::~ConstChar16Ptr(&local_518);
          }
          df.super_LocalPointerBase<icu_63::DecimalFormat>.ptr =
               (LocalPointerBase<icu_63::DecimalFormat>)
               LocalPointerBase<icu_63::DecimalFormatSymbols>::getAlias
                         ((LocalPointerBase<icu_63::DecimalFormatSymbols> *)
                          ((long)&pattern.fUnion + 0x30));
          pDVar8 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,(size_t)pUVar9);
          local_660 = (DecimalFormat *)0x0;
          if (pDVar8 != (DecimalFormat *)0x0) {
            DecimalFormat::DecimalFormat
                      (pDVar8,(UnicodeString *)&ownedResource,
                       (DecimalFormatSymbols *)df.super_LocalPointerBase<icu_63::DecimalFormat>.ptr,
                       style,(UErrorCode *)
                             ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            local_660 = pDVar8;
          }
          LocalPointer<icu_63::DecimalFormat>::LocalPointer
                    ((LocalPointer<icu_63::DecimalFormat> *)&local_570,local_660);
          UVar2 = LocalPointerBase<icu_63::DecimalFormat>::isValid(&local_570);
          if (UVar2 == '\0') {
            *(undefined4 *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr = 7;
          }
          else {
            LocalPointerBase<icu_63::DecimalFormatSymbols>::orphan
                      ((LocalPointerBase<icu_63::DecimalFormatSymbols> *)
                       ((long)&pattern.fUnion + 0x30));
          }
          UVar2 = ::U_FAILURE(*(UErrorCode *)
                               ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
          if (UVar2 == '\0') {
            if (style == UNUM_CASH_CURRENCY) {
              pDVar8 = LocalPointerBase<icu_63::DecimalFormat>::operator->(&local_570);
              DecimalFormat::setCurrencyUsage
                        (pDVar8,UCURR_USAGE_CASH,
                         (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            }
            UVar2 = ::U_FAILURE(*(UErrorCode *)
                                 ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            if (UVar2 == '\0') {
              pDVar8 = LocalPointerBase<icu_63::DecimalFormat>::orphan(&local_570);
              LocalPointer<icu_63::NumberFormat>::adoptInstead
                        ((LocalPointer<icu_63::NumberFormat> *)((long)&nsDesc.fUnion + 0x30),
                         &pDVar8->super_NumberFormat);
              bVar1 = false;
            }
            else {
              desiredLocale_local = (Locale *)0x0;
              bVar1 = true;
            }
          }
          else {
            desiredLocale_local = (Locale *)0x0;
            bVar1 = true;
          }
          LocalPointer<icu_63::DecimalFormat>::~LocalPointer
                    ((LocalPointer<icu_63::DecimalFormat> *)&local_570);
          if (!bVar1) goto LAB_0034d31f;
        }
        else {
          icu_63::UnicodeString::UnicodeString
                    ((UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30));
          icu_63::UnicodeString::UnicodeString
                    ((UnicodeString *)((long)&nsRuleSetName.fUnion + 0x30));
          icu_63::UnicodeString::UnicodeString((UnicodeString *)&nsLoc.fIsBogus);
          Locale::Locale((Locale *)local_2c0);
          local_2c4 = URBNF_NUMBERING_SYSTEM;
          (*(pNStack_38->super_UObject)._vptr_UObject[3])(&lastSlash);
          icu_63::UnicodeString::setTo
                    ((UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),
                     (UnicodeString *)&lastSlash);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&lastSlash);
          nsLocID._60_4_ =
               icu_63::UnicodeString::indexOf
                         ((UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),L'/');
          nsLocID.len = icu_63::UnicodeString::lastIndexOf
                                  ((UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),L'/');
          if ((int)nsLocID._60_4_ < nsLocID.len) {
            CharString::CharString((CharString *)local_350);
            icu_63::UnicodeString::tempSubString
                      (&local_390,(UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),0,
                       nsLocID._60_4_);
            CharString::appendInvariantChars
                      ((CharString *)local_350,&local_390,
                       (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            icu_63::UnicodeString::~UnicodeString(&local_390);
            icu_63::UnicodeString::setTo
                      ((UnicodeString *)((long)&nsRuleSetName.fUnion + 0x30),
                       (UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),nsLocID._60_4_ + 1,
                       ~nsLocID._60_4_ + nsLocID.len);
            icu_63::UnicodeString::setTo
                      ((UnicodeString *)&nsLoc.fIsBogus,
                       (UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30),nsLocID.len + 1);
            pcVar5 = CharString::data((CharString *)local_350);
            Locale::createFromName((Locale *)((long)&SpelloutRules.fUnion + 0x30),pcVar5);
            other = (Locale *)((long)&SpelloutRules.fUnion + 0x30);
            Locale::operator=((Locale *)local_2c0,other);
            Locale::~Locale(other);
            ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&r,L"SpelloutRules");
            icu_63::UnicodeString::UnicodeString
                      ((UnicodeString *)local_4b0,'\x01',(ConstChar16Ptr *)&r,-1);
            ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&r);
            pUVar9 = (UnicodeString *)local_4b0;
            iVar3 = icu_63::UnicodeString::compare
                              ((UnicodeString *)((long)&nsRuleSetName.fUnion + 0x30),pUVar9);
            if (iVar3 == '\0') {
              local_2c4 = URBNF_SPELLOUT;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_4b0);
            CharString::~CharString((CharString *)local_350);
          }
          else {
            Locale::operator=((Locale *)local_2c0,desiredLocale);
            pUVar9 = (UnicodeString *)(&nsRuleSetGroup.fUnion.fFields + 2);
            icu_63::UnicodeString::setTo((UnicodeString *)&nsLoc.fIsBogus,pUVar9);
          }
          this = (RuleBasedNumberFormat *)UMemory::operator_new((UMemory *)0x2f0,(size_t)pUVar9);
          local_4c9 = 0;
          local_648 = (RuleBasedNumberFormat *)0x0;
          if (this != (RuleBasedNumberFormat *)0x0) {
            local_4c9 = 1;
            local_4c8 = this;
            RuleBasedNumberFormat::RuleBasedNumberFormat
                      (this,local_2c4,(Locale *)local_2c0,
                       (UErrorCode *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            local_648 = this;
          }
          local_4c0 = local_648;
          if (local_648 != (RuleBasedNumberFormat *)0x0) {
            (*(local_648->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2f])
                      (local_648,&nsLoc.fIsBogus,
                       ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            LocalPointer<icu_63::NumberFormat>::adoptInstead
                      ((LocalPointer<icu_63::NumberFormat> *)((long)&nsDesc.fUnion + 0x30),
                       &local_4c0->super_NumberFormat);
          }
          else {
            *(undefined4 *)ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr = 7;
            desiredLocale_local = (Locale *)0x0;
          }
          Locale::~Locale((Locale *)local_2c0);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&nsLoc.fIsBogus);
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)((long)&nsRuleSetName.fUnion + 0x30));
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)((long)&nsRuleSetGroup.fUnion + 0x30));
          if (local_648 != (RuleBasedNumberFormat *)0x0) {
LAB_0034d31f:
            this_00 = LocalPointerBase<icu_63::NumberFormat>::operator->
                                ((LocalPointerBase<icu_63::NumberFormat> *)
                                 ((long)&nsDesc.fUnion + 0x30));
            pUVar6 = LocalPointerBase<UResourceBundle>::getAlias(&local_b0);
            pcVar5 = ures_getLocaleByType_63
                               (pUVar6,ULOC_VALID_LOCALE,
                                (UErrorCode *)
                                ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            pUVar6 = LocalPointerBase<UResourceBundle>::getAlias(&local_b0);
            actual = ures_getLocaleByType_63
                               (pUVar6,ULOC_ACTUAL_LOCALE,
                                (UErrorCode *)
                                ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            Format::setLocaleIDs(&this_00->super_Format,pcVar5,actual);
            UVar2 = ::U_FAILURE(*(UErrorCode *)
                                 ownedNs.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
            if (UVar2 == '\0') {
              desiredLocale_local =
                   (Locale *)
                   LocalPointerBase<icu_63::NumberFormat>::orphan
                             ((LocalPointerBase<icu_63::NumberFormat> *)
                              ((long)&nsDesc.fUnion + 0x30));
            }
            else {
              desiredLocale_local = (Locale *)0x0;
            }
          }
        }
        LocalPointer<icu_63::NumberFormat>::~LocalPointer
                  ((LocalPointer<icu_63::NumberFormat> *)((long)&nsDesc.fUnion + 0x30));
      }
      else {
        desiredLocale_local = (Locale *)0x0;
      }
    }
    else {
      desiredLocale_local = (Locale *)0x0;
    }
  }
  else {
    desiredLocale_local = (Locale *)0x0;
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_b0);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&ownedResource);
  LocalPointer<icu_63::DecimalFormatSymbols>::~LocalPointer
            ((LocalPointer<icu_63::DecimalFormatSymbols> *)((long)&pattern.fUnion + 0x30));
LAB_0034d46a:
  LocalPointer<icu_63::NumberingSystem>::~LocalPointer((LocalPointer<icu_63::NumberingSystem> *)&ns)
  ;
  return (NumberFormat *)desiredLocale_local;
}

Assistant:

NumberFormat*
NumberFormat::makeInstance(const Locale& desiredLocale,
                           UNumberFormatStyle style,
                           UBool mustBeDecimalFormat,
                           UErrorCode& status) {
    if (U_FAILURE(status)) return NULL;

    if (style < 0 || style >= UNUM_FORMAT_STYLE_COUNT) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    // Some styles are not supported. This is a result of merging
    // the @draft ICU 4.2 NumberFormat::EStyles into the long-existing UNumberFormatStyle.
    // Ticket #8503 is for reviewing/fixing/merging the two relevant implementations:
    // this one and unum_open().
    // The UNUM_PATTERN_ styles are not supported here
    // because this method does not take a pattern string.
    if (!isStyleSupported(style)) {
        status = U_UNSUPPORTED_ERROR;
        return NULL;
    }

#if U_PLATFORM_USES_ONLY_WIN32_API
    if (!mustBeDecimalFormat) {
        char buffer[8];
        int32_t count = desiredLocale.getKeywordValue("compat", buffer, sizeof(buffer), status);

        // if the locale has "@compat=host", create a host-specific NumberFormat
        if (U_SUCCESS(status) && count > 0 && uprv_strcmp(buffer, "host") == 0) {
            UBool curr = TRUE;

            switch (style) {
            case UNUM_DECIMAL:
                curr = FALSE;
                // fall-through
                U_FALLTHROUGH;

            case UNUM_CURRENCY:
            case UNUM_CURRENCY_ISO: // do not support plural formatting here
            case UNUM_CURRENCY_PLURAL:
            case UNUM_CURRENCY_ACCOUNTING:
            case UNUM_CASH_CURRENCY:
            case UNUM_CURRENCY_STANDARD:
            {
                LocalPointer<Win32NumberFormat> f(new Win32NumberFormat(desiredLocale, curr, status), status);
                if (U_SUCCESS(status)) {
                    return f.orphan();
                }
            }
            break;
            default:
                break;
            }
        }
    }
#endif
    // Use numbering system cache hashtable
    umtx_initOnce(gNSCacheInitOnce, &nscacheInit);

    // Get cached numbering system
    LocalPointer<NumberingSystem> ownedNs;
    NumberingSystem *ns = NULL;
    if (NumberingSystem_cache != NULL) {
        // TODO: Bad hash key usage, see ticket #8504.
        int32_t hashKey = desiredLocale.hashCode();

        Mutex lock(&nscacheMutex);
        ns = (NumberingSystem *)uhash_iget(NumberingSystem_cache, hashKey);
        if (ns == NULL) {
            ns = NumberingSystem::createInstance(desiredLocale,status);
            uhash_iput(NumberingSystem_cache, hashKey, (void*)ns, &status);
        }
    } else {
        ownedNs.adoptInstead(NumberingSystem::createInstance(desiredLocale,status));
        ns = ownedNs.getAlias();
    }

    // check results of getting a numbering system
    if (U_FAILURE(status)) {
        return NULL;
    }

    if (mustBeDecimalFormat && ns->isAlgorithmic()) {
        status = U_UNSUPPORTED_ERROR;
        return NULL;
    }

    LocalPointer<DecimalFormatSymbols> symbolsToAdopt;
    UnicodeString pattern;
    LocalUResourceBundlePointer ownedResource(ures_open(NULL, desiredLocale.getName(), &status));
    if (U_FAILURE(status)) {
        return NULL;
    }
    else {
        // Loads the decimal symbols of the desired locale.
        symbolsToAdopt.adoptInsteadAndCheckErrorCode(new DecimalFormatSymbols(desiredLocale, status), status);
        if (U_FAILURE(status)) {
            return NULL;
        }

        // Load the pattern from data using the common library function
        const char16_t* patternPtr = number::impl::utils::getPatternForStyle(
                desiredLocale,
                ns->getName(),
                gFormatCldrStyles[style],
                status);
        pattern = UnicodeString(TRUE, patternPtr, -1);
    }
    if (U_FAILURE(status)) {
        return NULL;
    }
    if(style==UNUM_CURRENCY || style == UNUM_CURRENCY_ISO || style == UNUM_CURRENCY_ACCOUNTING 
        || style == UNUM_CASH_CURRENCY || style == UNUM_CURRENCY_STANDARD){
        const UChar* currPattern = symbolsToAdopt->getCurrencyPattern();
        if(currPattern!=NULL){
            pattern.setTo(currPattern, u_strlen(currPattern));
        }
    }

    LocalPointer<NumberFormat> f;
    if (ns->isAlgorithmic()) {
        UnicodeString nsDesc;
        UnicodeString nsRuleSetGroup;
        UnicodeString nsRuleSetName;
        Locale nsLoc;
        URBNFRuleSetTag desiredRulesType = URBNF_NUMBERING_SYSTEM;

        nsDesc.setTo(ns->getDescription());
        int32_t firstSlash = nsDesc.indexOf(gSlash);
        int32_t lastSlash = nsDesc.lastIndexOf(gSlash);
        if ( lastSlash > firstSlash ) {
            CharString nsLocID;

            nsLocID.appendInvariantChars(nsDesc.tempSubString(0, firstSlash), status);
            nsRuleSetGroup.setTo(nsDesc,firstSlash+1,lastSlash-firstSlash-1);
            nsRuleSetName.setTo(nsDesc,lastSlash+1);

            nsLoc = Locale::createFromName(nsLocID.data());

            UnicodeString SpelloutRules = UNICODE_STRING_SIMPLE("SpelloutRules");
            if ( nsRuleSetGroup.compare(SpelloutRules) == 0 ) {
                desiredRulesType = URBNF_SPELLOUT;
            }
        } else {
            nsLoc = desiredLocale;
            nsRuleSetName.setTo(nsDesc);
        }

        RuleBasedNumberFormat *r = new RuleBasedNumberFormat(desiredRulesType,nsLoc,status);
        if (r == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        r->setDefaultRuleSet(nsRuleSetName,status);
        f.adoptInstead(r);
    } else {
        // replace single currency sign in the pattern with double currency sign
        // if the style is UNUM_CURRENCY_ISO
        if (style == UNUM_CURRENCY_ISO) {
            pattern.findAndReplace(UnicodeString(TRUE, gSingleCurrencySign, 1),
                                   UnicodeString(TRUE, gDoubleCurrencySign, 2));
        }

        // "new DecimalFormat()" does not adopt the symbols argument if its memory allocation fails.
        // So we can't use adoptInsteadAndCheckErrorCode as we need to know if the 'new' failed.
        DecimalFormatSymbols *syms = symbolsToAdopt.getAlias();
        LocalPointer<DecimalFormat> df(new DecimalFormat(pattern, syms, style, status));

        if (df.isValid()) {
            // if the DecimalFormat object was successfully new'ed, then it will own symbolsToAdopt, even if the status is a failure.
            symbolsToAdopt.orphan();
        }
        else {
            status = U_MEMORY_ALLOCATION_ERROR;
        }

        if (U_FAILURE(status)) {
            return nullptr;
        }

        // if it is cash currency style, setCurrencyUsage with usage
        if (style == UNUM_CASH_CURRENCY){
            df->setCurrencyUsage(UCURR_USAGE_CASH, &status);
        }

        if (U_FAILURE(status)) {
            return nullptr;
        }

        f.adoptInstead(df.orphan());
    }

    f->setLocaleIDs(ures_getLocaleByType(ownedResource.getAlias(), ULOC_VALID_LOCALE, &status),
                    ures_getLocaleByType(ownedResource.getAlias(), ULOC_ACTUAL_LOCALE, &status));
    if (U_FAILURE(status)) {
        return NULL;
    }
    return f.orphan();
}